

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_spi_init_pre(int bus)

{
  mraa_gpio_context p_Var1;
  mraa_gpio_context p_Var2;
  mraa_gpio_context p_Var3;
  mraa_gpio_context p_Var4;
  
  if (miniboard == '\x01') {
    mraa_intel_edison_pinmode_change(0x73,1);
    mraa_intel_edison_pinmode_change(0x72,1);
    mraa_intel_edison_pinmode_change(0x6d,1);
  }
  else {
    mraa_gpio_write(tristate,0);
    p_Var1 = mraa_gpio_init_raw(0x102);
    p_Var2 = mraa_gpio_init_raw(0x103);
    p_Var3 = mraa_gpio_init_raw(0x104);
    p_Var4 = mraa_gpio_init_raw(0x105);
    mraa_gpio_dir(p_Var1,MRAA_GPIO_OUT);
    mraa_gpio_dir(p_Var2,MRAA_GPIO_OUT);
    mraa_gpio_dir(p_Var3,MRAA_GPIO_OUT);
    mraa_gpio_dir(p_Var4,MRAA_GPIO_OUT);
    mraa_gpio_write(p_Var1,1);
    mraa_gpio_write(p_Var2,1);
    mraa_gpio_write(p_Var3,0);
    mraa_gpio_write(p_Var4,1);
    mraa_gpio_close(p_Var1);
    mraa_gpio_close(p_Var2);
    mraa_gpio_close(p_Var3);
    mraa_gpio_close(p_Var4);
    p_Var1 = mraa_gpio_init_raw(0xe2);
    p_Var2 = mraa_gpio_init_raw(0xe3);
    p_Var3 = mraa_gpio_init_raw(0xe4);
    p_Var4 = mraa_gpio_init_raw(0xe5);
    mraa_gpio_dir(p_Var1,MRAA_GPIO_IN);
    mraa_gpio_dir(p_Var2,MRAA_GPIO_IN);
    mraa_gpio_dir(p_Var3,MRAA_GPIO_IN);
    mraa_gpio_dir(p_Var4,MRAA_GPIO_IN);
    mraa_gpio_close(p_Var1);
    mraa_gpio_close(p_Var2);
    mraa_gpio_close(p_Var3);
    mraa_gpio_close(p_Var4);
  }
  return MRAA_SUCCESS;
}

Assistant:

mraa_result_t
mraa_intel_edison_spi_init_pre(int bus)
{
    if (miniboard == 1) {
        mraa_intel_edison_pinmode_change(115, 1);
        mraa_intel_edison_pinmode_change(114, 1);
        mraa_intel_edison_pinmode_change(109, 1);
        return MRAA_SUCCESS;
    }

    mraa_gpio_write(tristate, 0);

    mraa_gpio_context io10_out = mraa_gpio_init_raw(258);
    mraa_gpio_context io11_out = mraa_gpio_init_raw(259);
    mraa_gpio_context io12_out = mraa_gpio_init_raw(260);
    mraa_gpio_context io13_out = mraa_gpio_init_raw(261);
    mraa_gpio_dir(io10_out, MRAA_GPIO_OUT);
    mraa_gpio_dir(io11_out, MRAA_GPIO_OUT);
    mraa_gpio_dir(io12_out, MRAA_GPIO_OUT);
    mraa_gpio_dir(io13_out, MRAA_GPIO_OUT);

    mraa_gpio_write(io10_out, 1);
    mraa_gpio_write(io11_out, 1);
    mraa_gpio_write(io12_out, 0);
    mraa_gpio_write(io13_out, 1);

    mraa_gpio_close(io10_out);
    mraa_gpio_close(io11_out);
    mraa_gpio_close(io12_out);
    mraa_gpio_close(io13_out);

    mraa_gpio_context io10_pull = mraa_gpio_init_raw(226);
    mraa_gpio_context io11_pull = mraa_gpio_init_raw(227);
    mraa_gpio_context io12_pull = mraa_gpio_init_raw(228);
    mraa_gpio_context io13_pull = mraa_gpio_init_raw(229);

    mraa_gpio_dir(io10_pull, MRAA_GPIO_IN);
    mraa_gpio_dir(io11_pull, MRAA_GPIO_IN);
    mraa_gpio_dir(io12_pull, MRAA_GPIO_IN);
    mraa_gpio_dir(io13_pull, MRAA_GPIO_IN);

    mraa_gpio_close(io10_pull);
    mraa_gpio_close(io11_pull);
    mraa_gpio_close(io12_pull);
    mraa_gpio_close(io13_pull);

    return MRAA_SUCCESS;
}